

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void read_bytes<double,double>
               (void *ptr,size_t n_els,char **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian)

{
  byte bVar1;
  double *in_RCX;
  byte in_R8B;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_R8B & 1;
  read_bytes<double>(in_RCX,CONCAT17(in_R8B,in_stack_ffffffffffffffd8) & 0x1ffffffffffffff,
                     (char **)0x65f255);
  if ((bVar1 & 1) != 0) {
    swap_endianness<double>(in_RCX,CONCAT17(bVar1,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void read_bytes(void *ptr, const size_t n_els, const char *&in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(ptr, n_els, in);
        if (unlikely(diff_endian)) swap_endianness((dtype*)ptr, n_els);
        return;
    }
    if (n_els == 0) return;
    if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
        buffer.resize((size_t)2 * n_els * sizeof(saved_type));
    memcpy(buffer.data(), in, n_els * sizeof(saved_type));
    in += n_els * sizeof(saved_type);

    if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
    convert_dtype<dtype, saved_type>(ptr, buffer, n_els);
}